

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::~BinaryRegistryWriter(BinaryRegistryWriter *this)

{
  ProgramBinary *pPVar1;
  pointer puVar2;
  pointer pBVar3;
  
  pBVar3 = (this->m_binaries).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar3 != (this->m_binaries).
                super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pPVar1 = pBVar3->binary;
      if ((pPVar1 != (ProgramBinary *)0x0) &&
         (puVar2 = (pPVar1->m_binary).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start, puVar2 != (pointer)0x0)) {
        operator_delete(puVar2,(long)(pPVar1->m_binary).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      operator_delete(pPVar1,0x20);
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != (this->m_binaries).
                       super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    pBVar3 = (this->m_binaries).
             super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pBVar3 != (pointer)0x0) {
    operator_delete(pBVar3,(long)(this->m_binaries).
                                 super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar3);
  }
  deMemPool_destroy((this->m_binaryHash).m_memPool.m_pool);
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::~vector(&this->m_binaryIndices);
  return;
}

Assistant:

BinaryRegistryWriter::~BinaryRegistryWriter (void)
{
	for (BinaryVector::const_iterator binaryIter = m_binaries.begin();
		 binaryIter != m_binaries.end();
		 ++binaryIter)
		delete binaryIter->binary;
}